

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaExist.c
# Opt level: O2

void Gia_ManQuantSetSuppAnd(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  undefined8 uVar1;
  int iVar2;
  uint uVar3;
  word *pwVar4;
  word *pwVar5;
  word *pwVar6;
  ulong uVar7;
  ulong uVar8;
  
  iVar2 = Gia_ObjId(p,pObj);
  uVar1 = *(undefined8 *)pObj;
  uVar3 = (uint)uVar1;
  if ((-1 < (int)uVar3) && ((uVar3 & 0x1fffffff) != 0x1fffffff)) {
    Gia_ManQuantSetSuppZero(p);
    pwVar4 = Gia_ManQuantInfo(p,pObj);
    pwVar5 = Gia_ManQuantInfoId(p,iVar2 - (uVar3 & 0x1fffffff));
    pwVar6 = Gia_ManQuantInfoId(p,iVar2 - ((uint)((ulong)uVar1 >> 0x20) & 0x1fffffff));
    uVar8 = 0;
    uVar7 = (ulong)(uint)p->nSuppWords;
    if (p->nSuppWords < 1) {
      uVar7 = uVar8;
    }
    for (; uVar7 != uVar8; uVar8 = uVar8 + 1) {
      pwVar4[uVar8] = pwVar6[uVar8] | pwVar5[uVar8];
    }
    return;
  }
  __assert_fail("Gia_ObjIsAnd(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaExist.c"
                ,0x95,"void Gia_ManQuantSetSuppAnd(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

void Gia_ManQuantSetSuppAnd( Gia_Man_t * p, Gia_Obj_t * pObj )
{
    int iObj  = Gia_ObjId(p, pObj);
    int iFan0 = Gia_ObjFaninId0(pObj, iObj);
    int iFan1 = Gia_ObjFaninId1(pObj, iObj);
    assert( Gia_ObjIsAnd(pObj) );
    Gia_ManQuantSetSuppZero( p );
    Abc_TtOr( Gia_ManQuantInfo(p, pObj), Gia_ManQuantInfoId(p, iFan0), Gia_ManQuantInfoId(p, iFan1), p->nSuppWords );
}